

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preset.cpp
# Opt level: O3

void __thiscall sf2cute::SFPreset::SetBackwardReferences(SFPreset *this)

{
  pointer puVar1;
  SFPresetZone *this_00;
  unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_> *zone;
  pointer puVar2;
  
  puVar1 = (this->zones_).
           super__Vector_base<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar2 = (this->zones_).
                super__Vector_base<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    SFPresetZone::set_parent_preset
              ((puVar2->_M_t).
               super___uniq_ptr_impl<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>
               ._M_t.
               super__Tuple_impl<0UL,_sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>
               .super__Head_base<0UL,_sf2cute::SFPresetZone_*,_false>._M_head_impl,this);
  }
  this_00 = (this->global_zone_)._M_t.
            super___uniq_ptr_impl<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>
            ._M_t.
            super__Tuple_impl<0UL,_sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>
            .super__Head_base<0UL,_sf2cute::SFPresetZone_*,_false>._M_head_impl;
  if (this_00 != (SFPresetZone *)0x0) {
    SFPresetZone::set_parent_preset(this_00,this);
    return;
  }
  return;
}

Assistant:

void SFPreset::SetBackwardReferences() noexcept {
  // Update the preset zones.
  for (const auto & zone : zones_) {
    zone->set_parent_preset(*this);
  }

  // Update the global preset zone.
  if (has_global_zone()) {
    global_zone_->set_parent_preset(*this);
  }
}